

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitwise.cpp
# Opt level: O3

hugeint_t duckdb::BitwiseShiftLeftOperator::
          Operation<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::hugeint_t>
                    (hugeint_t input,hugeint_t shift)

{
  bool bVar1;
  OutOfRangeException *pOVar2;
  uint64_t in_RCX;
  NumericHelper *in_RDX;
  uint64_t in_RSI;
  NumericHelper *in_RDI;
  hugeint_t value;
  hugeint_t value_00;
  hugeint_t value_01;
  hugeint_t value_02;
  hugeint_t value_03;
  hugeint_t max_shift;
  hugeint_t max_value;
  string local_168;
  hugeint_t local_148;
  hugeint_t local_138;
  hugeint_t local_128;
  hugeint_t local_110;
  hugeint_t local_100;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  hugeint_t local_50;
  hugeint_t local_40;
  hugeint_t local_30;
  
  local_148.lower = (uint64_t)in_RDX;
  local_148.upper = in_RCX;
  local_138.lower = (uint64_t)in_RDI;
  local_138.upper = in_RSI;
  hugeint_t::hugeint_t((hugeint_t *)&local_168,0x80);
  hugeint_t::hugeint_t(&local_100,0);
  local_110 = hugeint_t::operator+((hugeint_t *)&local_168,&local_100);
  hugeint_t::hugeint_t((hugeint_t *)&local_168,0);
  bVar1 = hugeint_t::operator<(&local_138,(hugeint_t *)&local_168);
  if (bVar1) {
    pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_168,"Cannot left-shift negative number %s","");
    value.upper = in_RCX;
    value.lower = local_138.upper;
    NumericHelper::ToString<duckdb::hugeint_t>(&local_70,(NumericHelper *)local_138.lower,value);
    OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_168,&local_70);
    __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
  }
  hugeint_t::hugeint_t((hugeint_t *)&local_168,0);
  bVar1 = hugeint_t::operator<(&local_148,(hugeint_t *)&local_168);
  if (!bVar1) {
    bVar1 = hugeint_t::operator>=(&local_148,&local_110);
    if (bVar1) {
      hugeint_t::hugeint_t((hugeint_t *)&local_168,0);
      bVar1 = hugeint_t::operator==(&local_138,(hugeint_t *)&local_168);
      if (!bVar1) {
        pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
        local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
        ::std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_168,"Left-shift value %s is out of range","");
        value_01.upper = in_RCX;
        value_01.lower = local_148.upper;
        NumericHelper::ToString<duckdb::hugeint_t>
                  (&local_b0,(NumericHelper *)local_148.lower,value_01);
        OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_168,&local_b0);
        __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
      }
      hugeint_t::hugeint_t(&local_128,0);
    }
    else {
      hugeint_t::hugeint_t((hugeint_t *)&local_168,0);
      bVar1 = hugeint_t::operator==(&local_148,(hugeint_t *)&local_168);
      if (bVar1) {
        local_128.upper = local_138.upper;
        local_128.lower = local_138.lower;
      }
      else {
        hugeint_t::hugeint_t((hugeint_t *)&local_168,1);
        local_40 = hugeint_t::operator-(&local_110,&local_148);
        hugeint_t::hugeint_t(&local_50,1);
        local_30 = hugeint_t::operator-(&local_40,&local_50);
        local_100 = hugeint_t::operator<<((hugeint_t *)&local_168,&local_30);
        bVar1 = hugeint_t::operator>=(&local_138,&local_100);
        if (bVar1) {
          pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
          local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_168,"Overflow in left shift (%s << %s)","");
          value_02.upper = in_RCX;
          value_02.lower = local_138.upper;
          NumericHelper::ToString<duckdb::hugeint_t>
                    (&local_d0,(NumericHelper *)local_138.lower,value_02);
          value_03.upper = in_RCX;
          value_03.lower = local_148.upper;
          NumericHelper::ToString<duckdb::hugeint_t>
                    (&local_f0,(NumericHelper *)local_148.lower,value_03);
          OutOfRangeException::OutOfRangeException<std::__cxx11::string,std::__cxx11::string>
                    (pOVar2,&local_168,&local_d0,&local_f0);
          __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
        }
        local_128 = hugeint_t::operator<<(&local_138,&local_148);
      }
    }
    return local_128;
  }
  pOVar2 = (OutOfRangeException *)__cxa_allocate_exception(0x10);
  local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_168,"Cannot left-shift by negative number %s","");
  value_00.upper = in_RCX;
  value_00.lower = local_148.upper;
  NumericHelper::ToString<duckdb::hugeint_t>(&local_90,(NumericHelper *)local_148.lower,value_00);
  OutOfRangeException::OutOfRangeException<std::__cxx11::string>(pOVar2,&local_168,&local_90);
  __cxa_throw(pOVar2,&OutOfRangeException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

static inline TR Operation(TA input, TB shift) {
		TA max_shift = TA(sizeof(TA) * 8) + (NumericLimits<TA>::IsSigned() ? 0 : 1);
		if (input < 0) {
			throw OutOfRangeException("Cannot left-shift negative number %s", NumericHelper::ToString(input));
		}
		if (shift < 0) {
			throw OutOfRangeException("Cannot left-shift by negative number %s", NumericHelper::ToString(shift));
		}
		if (shift >= max_shift) {
			if (input == 0) {
				return 0;
			}
			throw OutOfRangeException("Left-shift value %s is out of range", NumericHelper::ToString(shift));
		}
		if (shift == 0) {
			return input;
		}
		TA max_value = UnsafeNumericCast<TA>((TA(1) << (max_shift - shift - 1)));
		if (input >= max_value) {
			throw OutOfRangeException("Overflow in left shift (%s << %s)", NumericHelper::ToString(input),
			                          NumericHelper::ToString(shift));
		}
		return UnsafeNumericCast<TR>(input << shift);
	}